

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::BVHNIntersector1<8,_16781328,_true,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  bool bVar5;
  float fVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [32];
  byte bVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar17) [32];
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  float fVar72;
  undefined4 uVar73;
  vfloat4 a0;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM17 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_23b8 [4];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [16];
  undefined1 local_2388 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar29 [16];
  undefined1 auVar47 [32];
  int iVar24;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar27 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    auVar11 = ZEXT812(0) << 0x20;
    auVar30 = ZEXT816(0) << 0x40;
    auVar26._4_12_ = auVar11;
    auVar26._0_4_ = auVar27._0_4_;
    auVar25 = vrsqrt14ss_avx512f(auVar30,auVar26);
    fVar72 = auVar25._0_4_;
    uVar2 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    local_23b8[0] = fVar72 * 1.5 - auVar27._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    fVar72 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar74._0_4_ = aVar4.x * local_23b8[0];
    auVar74._4_4_ = aVar4.y * local_23b8[0];
    auVar74._8_4_ = aVar4.z * local_23b8[0];
    auVar74._12_4_ = aVar4.field_3.w * local_23b8[0];
    auVar25 = vshufpd_avx(auVar74,auVar74,1);
    auVar27 = vmovshdup_avx(auVar74);
    auVar83._8_4_ = 0x80000000;
    auVar83._0_8_ = 0x8000000080000000;
    auVar83._12_4_ = 0x80000000;
    auVar80._0_4_ = auVar27._0_4_ ^ 0x80000000;
    auVar27 = vunpckhps_avx(auVar74,auVar30);
    auVar80._4_12_ = auVar11;
    auVar28 = vshufps_avx(auVar27,auVar80,0x41);
    auVar78._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
    auVar78._8_8_ = auVar83._8_8_ ^ auVar25._8_8_;
    auVar26 = vinsertps_avx(auVar78,auVar74,0x2a);
    auVar27 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar25 = vdpps_avx(auVar26,auVar26,0x7f);
    uVar7 = vcmpps_avx512vl(auVar25,auVar27,1);
    auVar27 = vpmovm2d_avx512vl(uVar7);
    auVar84._0_4_ = auVar27._0_4_;
    auVar84._4_4_ = auVar84._0_4_;
    auVar84._8_4_ = auVar84._0_4_;
    auVar84._12_4_ = auVar84._0_4_;
    uVar22 = vpmovd2m_avx512vl(auVar84);
    auVar27 = vpcmpeqd_avx(auVar84,auVar84);
    auVar25._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar27._4_4_;
    auVar25._0_4_ = (uint)((byte)uVar22 & 1) * auVar27._0_4_;
    auVar25._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar27._8_4_;
    auVar25._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar27._12_4_;
    auVar27 = vblendvps_avx(auVar26,auVar28,auVar25);
    auVar25 = vdpps_avx(auVar27,auVar27,0x7f);
    auVar85._4_12_ = auVar11;
    auVar85._0_4_ = auVar25._0_4_;
    auVar26 = vrsqrt14ss_avx512f(auVar30,auVar85);
    fVar82 = auVar26._0_4_;
    fVar82 = fVar82 * 1.5 - fVar82 * fVar82 * fVar82 * auVar25._0_4_ * 0.5;
    auVar79._0_4_ = auVar27._0_4_ * fVar82;
    auVar79._4_4_ = auVar27._4_4_ * fVar82;
    auVar79._8_4_ = auVar27._8_4_ * fVar82;
    auVar79._12_4_ = auVar27._12_4_ * fVar82;
    auVar27 = vshufps_avx(auVar79,auVar79,0xc9);
    auVar25 = vshufps_avx(auVar74,auVar74,0xc9);
    auVar86._0_4_ = auVar25._0_4_ * auVar79._0_4_;
    auVar86._4_4_ = auVar25._4_4_ * auVar79._4_4_;
    auVar86._8_4_ = auVar25._8_4_ * auVar79._8_4_;
    auVar86._12_4_ = auVar25._12_4_ * auVar79._12_4_;
    auVar27 = vfmsub231ps_fma(auVar86,auVar74,auVar27);
    auVar25 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar27 = vdpps_avx(auVar25,auVar25,0x7f);
    auVar88._4_12_ = auVar11;
    auVar88._0_4_ = auVar27._0_4_;
    auVar26 = vrsqrt14ss_avx512f(auVar30,auVar88);
    fVar82 = auVar26._0_4_;
    fVar82 = fVar82 * 1.5 - fVar82 * fVar82 * fVar82 * auVar27._0_4_ * 0.5;
    auVar75._0_4_ = fVar82 * auVar25._0_4_;
    auVar75._4_4_ = fVar82 * auVar25._4_4_;
    auVar75._8_4_ = fVar82 * auVar25._8_4_;
    auVar75._12_4_ = fVar82 * auVar25._12_4_;
    auVar70._0_4_ = local_23b8[0] * auVar74._0_4_;
    auVar70._4_4_ = local_23b8[0] * auVar74._4_4_;
    auVar70._8_4_ = local_23b8[0] * auVar74._8_4_;
    auVar70._12_4_ = local_23b8[0] * auVar74._12_4_;
    auVar26 = vunpcklps_avx(auVar79,auVar70);
    auVar27 = vunpckhps_avx(auVar79,auVar70);
    auVar28 = vunpcklps_avx(auVar75,auVar30);
    auVar25 = vunpckhps_avx(auVar75,auVar30);
    local_2388 = vunpcklps_avx(auVar27,auVar25);
    local_23a8 = vunpcklps_avx(auVar26,auVar28);
    local_2398 = vunpckhps_avx(auVar26,auVar28);
    puVar19 = local_2368;
    auVar25 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar26 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar27._8_4_ = 0x7fffffff;
    auVar27._0_8_ = 0x7fffffff7fffffff;
    auVar27._12_4_ = 0x7fffffff;
    auVar27 = vandps_avx512vl((undefined1  [16])aVar4,auVar27);
    auVar28._8_4_ = 0x219392ef;
    auVar28._0_8_ = 0x219392ef219392ef;
    auVar28._12_4_ = 0x219392ef;
    uVar22 = vcmpps_avx512vl(auVar27,auVar28,1);
    auVar76._8_4_ = 0x3f800000;
    auVar76._0_8_ = 0x3f8000003f800000;
    auVar76._12_4_ = 0x3f800000;
    auVar27 = vdivps_avx(auVar76,(undefined1  [16])aVar4);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar5 = (bool)((byte)uVar22 & 1);
    auVar29._0_4_ = (uint)bVar5 * auVar28._0_4_ | (uint)!bVar5 * auVar27._0_4_;
    bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
    auVar29._4_4_ = (uint)bVar5 * auVar28._4_4_ | (uint)!bVar5 * auVar27._4_4_;
    bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
    auVar29._8_4_ = (uint)bVar5 * auVar28._8_4_ | (uint)!bVar5 * auVar27._8_4_;
    bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
    auVar29._12_4_ = (uint)bVar5 * auVar28._12_4_ | (uint)!bVar5 * auVar27._12_4_;
    auVar30._8_4_ = 0x3f7ffffa;
    auVar30._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar30._12_4_ = 0x3f7ffffa;
    auVar30 = vmulps_avx512vl(auVar29,auVar30);
    auVar31._8_4_ = 0x3f800003;
    auVar31._0_8_ = 0x3f8000033f800003;
    auVar31._12_4_ = 0x3f800003;
    auVar31 = vmulps_avx512vl(auVar29,auVar31);
    auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    local_2370[0] = 0;
    auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar35 = vbroadcastss_avx512vl(auVar30);
    auVar27 = vmovshdup_avx(auVar30);
    auVar36 = vbroadcastsd_avx512vl(auVar27);
    auVar28 = vshufpd_avx(auVar30,auVar30,1);
    auVar40._8_4_ = 2;
    auVar40._0_8_ = 0x200000002;
    auVar40._12_4_ = 2;
    auVar40._16_4_ = 2;
    auVar40._20_4_ = 2;
    auVar40._24_4_ = 2;
    auVar40._28_4_ = 2;
    auVar37 = vpermps_avx512vl(auVar40,ZEXT1632(auVar30));
    auVar38 = vbroadcastss_avx512vl(auVar31);
    auVar42._8_4_ = 1;
    auVar42._0_8_ = 0x100000001;
    auVar42._12_4_ = 1;
    auVar42._16_4_ = 1;
    auVar42._20_4_ = 1;
    auVar42._24_4_ = 1;
    auVar42._28_4_ = 1;
    auVar39 = vpermps_avx512vl(auVar42,ZEXT1632(auVar31));
    auVar40 = vpermps_avx512vl(auVar40,ZEXT1632(auVar31));
    uVar22 = (ulong)(auVar30._0_4_ < 0.0);
    uVar20 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x40;
    uVar21 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x80;
    uVar18 = uVar22 * 0x20 ^ 0x20;
    auVar41 = vbroadcastss_avx512vl(auVar25);
    uVar73 = auVar26._0_4_;
    auVar69 = ZEXT3264(CONCAT428(uVar73,CONCAT424(uVar73,CONCAT420(uVar73,CONCAT416(uVar73,CONCAT412
                                                  (uVar73,CONCAT48(uVar73,CONCAT44(uVar73,uVar73))))
                                                  ))));
    auVar42 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar89 = ZEXT3264(auVar42);
    auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    do {
      pfVar1 = (float *)(puVar19 + -1);
      puVar19 = puVar19 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar23 = *puVar19;
        while ((uVar23 & 8) == 0) {
          fVar82 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar14 = (uint)uVar23 & 7;
          pauVar17 = (undefined1 (*) [32])(uVar23 & 0xfffffffffffffff0);
          if (uVar14 == 3) {
            auVar42 = pauVar17[8];
            auVar43 = pauVar17[9];
            auVar44 = pauVar17[10];
            auVar91._4_4_ = fVar82;
            auVar91._0_4_ = fVar82;
            auVar91._8_4_ = fVar82;
            auVar91._12_4_ = fVar82;
            auVar91._16_4_ = fVar82;
            auVar91._20_4_ = fVar82;
            auVar91._24_4_ = fVar82;
            auVar91._28_4_ = fVar82;
            fVar6 = 1.0 - fVar82;
            auVar92._4_4_ = fVar6;
            auVar92._0_4_ = fVar6;
            auVar92._8_4_ = fVar6;
            auVar92._12_4_ = fVar6;
            auVar92._16_4_ = fVar6;
            auVar92._20_4_ = fVar6;
            auVar92._24_4_ = fVar6;
            auVar92._28_4_ = fVar6;
            auVar89._0_4_ = fVar82 * *(float *)pauVar17[0xe];
            auVar89._4_4_ = fVar82 * *(float *)(pauVar17[0xe] + 4);
            auVar89._8_4_ = fVar82 * *(float *)(pauVar17[0xe] + 8);
            auVar89._12_4_ = fVar82 * *(float *)(pauVar17[0xe] + 0xc);
            auVar89._16_4_ = fVar82 * *(float *)(pauVar17[0xe] + 0x10);
            auVar89._20_4_ = fVar82 * *(float *)(pauVar17[0xe] + 0x14);
            auVar89._28_36_ = auVar90._28_36_;
            auVar89._24_4_ = fVar82 * *(float *)(pauVar17[0xe] + 0x18);
            auVar87._0_4_ = fVar82 * *(float *)pauVar17[0xf];
            auVar87._4_4_ = fVar82 * *(float *)(pauVar17[0xf] + 4);
            auVar87._8_4_ = fVar82 * *(float *)(pauVar17[0xf] + 8);
            auVar87._12_4_ = fVar82 * *(float *)(pauVar17[0xf] + 0xc);
            auVar87._16_4_ = fVar82 * *(float *)(pauVar17[0xf] + 0x10);
            auVar87._20_4_ = fVar82 * *(float *)(pauVar17[0xf] + 0x14);
            auVar87._24_4_ = fVar82 * *(float *)(pauVar17[0xf] + 0x18);
            auVar87._28_4_ = 0;
            auVar81._0_4_ = fVar82 * *(float *)pauVar17[0x10];
            auVar81._4_4_ = fVar82 * *(float *)(pauVar17[0x10] + 4);
            auVar81._8_4_ = fVar82 * *(float *)(pauVar17[0x10] + 8);
            auVar81._12_4_ = fVar82 * *(float *)(pauVar17[0x10] + 0xc);
            auVar81._16_4_ = fVar82 * *(float *)(pauVar17[0x10] + 0x10);
            auVar81._20_4_ = fVar82 * *(float *)(pauVar17[0x10] + 0x14);
            auVar81._24_4_ = fVar82 * *(float *)(pauVar17[0x10] + 0x18);
            auVar81._28_4_ = 0;
            auVar27 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
            auVar45 = vfmadd231ps_avx512vl(auVar89._0_32_,auVar92,ZEXT1632(auVar27));
            auVar58 = vfmadd231ps_avx512vl(auVar87,auVar92,ZEXT1632(auVar27));
            auVar90._0_4_ = fVar82 * *(float *)pauVar17[0x11];
            auVar90._4_4_ = fVar82 * *(float *)(pauVar17[0x11] + 4);
            auVar90._8_4_ = fVar82 * *(float *)(pauVar17[0x11] + 8);
            auVar90._12_4_ = fVar82 * *(float *)(pauVar17[0x11] + 0xc);
            auVar90._16_4_ = fVar82 * *(float *)(pauVar17[0x11] + 0x10);
            auVar90._20_4_ = fVar82 * *(float *)(pauVar17[0x11] + 0x14);
            auVar90._28_36_ = in_ZMM15._28_36_;
            auVar90._24_4_ = fVar82 * *(float *)(pauVar17[0x11] + 0x18);
            auVar60 = vmulps_avx512vl(auVar91,pauVar17[0x12]);
            auVar48 = vfmadd231ps_avx512vl(auVar81,auVar92,ZEXT1632(auVar27));
            auVar46._4_4_ = fVar82 * *(float *)(pauVar17[0x13] + 4);
            auVar46._0_4_ = fVar82 * *(float *)pauVar17[0x13];
            auVar46._8_4_ = fVar82 * *(float *)(pauVar17[0x13] + 8);
            auVar46._12_4_ = fVar82 * *(float *)(pauVar17[0x13] + 0xc);
            auVar46._16_4_ = fVar82 * *(float *)(pauVar17[0x13] + 0x10);
            auVar46._20_4_ = fVar82 * *(float *)(pauVar17[0x13] + 0x14);
            auVar46._24_4_ = fVar82 * *(float *)(pauVar17[0x13] + 0x18);
            auVar46._28_4_ = fVar82;
            auVar49 = vaddps_avx512vl(auVar92,auVar90._0_32_);
            auVar50 = vaddps_avx512vl(auVar92,auVar60);
            in_ZMM17 = ZEXT3264(auVar50);
            auVar46 = vaddps_avx512vl(auVar92,auVar46);
            auVar60._4_4_ = fVar72 * auVar42._4_4_;
            auVar60._0_4_ = fVar72 * auVar42._0_4_;
            auVar60._8_4_ = fVar72 * auVar42._8_4_;
            auVar60._12_4_ = fVar72 * auVar42._12_4_;
            auVar60._16_4_ = fVar72 * auVar42._16_4_;
            auVar60._20_4_ = fVar72 * auVar42._20_4_;
            auVar60._24_4_ = fVar72 * auVar42._24_4_;
            auVar60._28_4_ = in_ZMM15._28_4_;
            auVar51._4_4_ = fVar72 * auVar43._4_4_;
            auVar51._0_4_ = fVar72 * auVar43._0_4_;
            auVar51._8_4_ = fVar72 * auVar43._8_4_;
            auVar51._12_4_ = fVar72 * auVar43._12_4_;
            auVar51._16_4_ = fVar72 * auVar43._16_4_;
            auVar51._20_4_ = fVar72 * auVar43._20_4_;
            auVar51._24_4_ = fVar72 * auVar43._24_4_;
            auVar51._28_4_ = fVar82;
            auVar59._4_4_ = fVar72 * auVar44._4_4_;
            auVar59._0_4_ = fVar72 * auVar44._0_4_;
            auVar59._8_4_ = fVar72 * auVar44._8_4_;
            auVar59._12_4_ = fVar72 * auVar44._12_4_;
            auVar59._16_4_ = fVar72 * auVar44._16_4_;
            auVar59._20_4_ = fVar72 * auVar44._20_4_;
            auVar59._24_4_ = fVar72 * auVar44._24_4_;
            auVar59._28_4_ = fVar72;
            auVar57._4_4_ = uVar3;
            auVar57._0_4_ = uVar3;
            auVar57._8_4_ = uVar3;
            auVar57._12_4_ = uVar3;
            auVar57._16_4_ = uVar3;
            auVar57._20_4_ = uVar3;
            auVar57._24_4_ = uVar3;
            auVar57._28_4_ = uVar3;
            auVar60 = vfmadd231ps_avx512vl(auVar60,auVar57,pauVar17[5]);
            auVar51 = vfmadd231ps_avx512vl(auVar51,auVar57,pauVar17[6]);
            auVar59 = vfmadd231ps_avx512vl(auVar59,auVar57,pauVar17[7]);
            auVar12._4_4_ = uVar2;
            auVar12._0_4_ = uVar2;
            auVar12._8_4_ = uVar2;
            auVar12._12_4_ = uVar2;
            auVar12._16_4_ = uVar2;
            auVar12._20_4_ = uVar2;
            auVar12._24_4_ = uVar2;
            auVar12._28_4_ = uVar2;
            auVar60 = vfmadd231ps_avx512vl(auVar60,auVar12,pauVar17[2]);
            auVar51 = vfmadd231ps_avx512vl(auVar51,auVar12,pauVar17[3]);
            auVar59 = vfmadd231ps_avx512vl(auVar59,auVar12,pauVar17[4]);
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar60,auVar52);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            uVar23 = vcmpps_avx512vl(auVar52,auVar53,1);
            bVar5 = (bool)((byte)uVar23 & 1);
            iVar24 = auVar53._0_4_;
            auVar54._0_4_ = (uint)bVar5 * iVar24 | (uint)!bVar5 * auVar60._0_4_;
            bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
            iVar62 = auVar53._4_4_;
            auVar54._4_4_ = (uint)bVar5 * iVar62 | (uint)!bVar5 * auVar60._4_4_;
            bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
            iVar63 = auVar53._8_4_;
            auVar54._8_4_ = (uint)bVar5 * iVar63 | (uint)!bVar5 * auVar60._8_4_;
            bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
            iVar64 = auVar53._12_4_;
            auVar54._12_4_ = (uint)bVar5 * iVar64 | (uint)!bVar5 * auVar60._12_4_;
            bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
            iVar65 = auVar53._16_4_;
            auVar54._16_4_ = (uint)bVar5 * iVar65 | (uint)!bVar5 * auVar60._16_4_;
            bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
            iVar66 = auVar53._20_4_;
            auVar54._20_4_ = (uint)bVar5 * iVar66 | (uint)!bVar5 * auVar60._20_4_;
            bVar5 = (bool)((byte)(uVar23 >> 6) & 1);
            iVar67 = auVar53._24_4_;
            iVar68 = auVar53._28_4_;
            auVar54._24_4_ = (uint)bVar5 * iVar67 | (uint)!bVar5 * auVar60._24_4_;
            bVar5 = SUB81(uVar23 >> 7,0);
            auVar54._28_4_ = (uint)bVar5 * iVar68 | (uint)!bVar5 * auVar60._28_4_;
            vandps_avx512vl(auVar51,auVar52);
            uVar23 = vcmpps_avx512vl(auVar54,auVar53,1);
            bVar5 = (bool)((byte)uVar23 & 1);
            auVar55._0_4_ = (uint)bVar5 * iVar24 | (uint)!bVar5 * auVar51._0_4_;
            bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar5 * iVar62 | (uint)!bVar5 * auVar51._4_4_;
            bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar5 * iVar63 | (uint)!bVar5 * auVar51._8_4_;
            bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
            auVar55._12_4_ = (uint)bVar5 * iVar64 | (uint)!bVar5 * auVar51._12_4_;
            bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
            auVar55._16_4_ = (uint)bVar5 * iVar65 | (uint)!bVar5 * auVar51._16_4_;
            bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
            auVar55._20_4_ = (uint)bVar5 * iVar66 | (uint)!bVar5 * auVar51._20_4_;
            bVar5 = (bool)((byte)(uVar23 >> 6) & 1);
            auVar55._24_4_ = (uint)bVar5 * iVar67 | (uint)!bVar5 * auVar51._24_4_;
            bVar5 = SUB81(uVar23 >> 7,0);
            auVar55._28_4_ = (uint)bVar5 * iVar68 | (uint)!bVar5 * auVar51._28_4_;
            vandps_avx512vl(auVar59,auVar52);
            uVar23 = vcmpps_avx512vl(auVar55,auVar53,1);
            bVar5 = (bool)((byte)uVar23 & 1);
            auVar56._0_4_ = (uint)bVar5 * iVar24 | (uint)!bVar5 * auVar59._0_4_;
            bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar5 * iVar62 | (uint)!bVar5 * auVar59._4_4_;
            bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar5 * iVar63 | (uint)!bVar5 * auVar59._8_4_;
            bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
            auVar56._12_4_ = (uint)bVar5 * iVar64 | (uint)!bVar5 * auVar59._12_4_;
            bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
            auVar56._16_4_ = (uint)bVar5 * iVar65 | (uint)!bVar5 * auVar59._16_4_;
            bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
            auVar56._20_4_ = (uint)bVar5 * iVar66 | (uint)!bVar5 * auVar59._20_4_;
            bVar5 = (bool)((byte)(uVar23 >> 6) & 1);
            auVar56._24_4_ = (uint)bVar5 * iVar67 | (uint)!bVar5 * auVar59._24_4_;
            bVar5 = SUB81(uVar23 >> 7,0);
            auVar56._28_4_ = (uint)bVar5 * iVar68 | (uint)!bVar5 * auVar59._28_4_;
            auVar60 = vrcp14ps_avx512vl(auVar54);
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar59 = vfnmadd213ps_avx512vl(auVar54,auVar60,auVar51);
            auVar60 = vfmadd132ps_avx512vl(auVar59,auVar60,auVar60);
            in_ZMM15 = ZEXT3264(auVar60);
            auVar59 = vrcp14ps_avx512vl(auVar55);
            auVar52 = vfnmadd213ps_avx512vl(auVar55,auVar59,auVar51);
            auVar59 = vfmadd132ps_avx512vl(auVar52,auVar59,auVar59);
            auVar52 = vrcp14ps_avx512vl(auVar56);
            auVar51 = vfnmadd213ps_avx512vl(auVar56,auVar52,auVar51);
            auVar51 = vfmadd132ps_avx512vl(auVar51,auVar52,auVar52);
            auVar42 = vfmadd213ps_avx512vl(auVar42,auVar34,pauVar17[0xb]);
            auVar52 = vfmadd231ps_avx512vl(auVar42,auVar33,pauVar17[5]);
            auVar42 = vfmadd213ps_avx512vl(auVar43,auVar34,pauVar17[0xc]);
            auVar43 = vfmadd231ps_avx512vl(auVar42,auVar33,pauVar17[6]);
            auVar42 = vfmadd213ps_avx512vl(auVar44,auVar34,pauVar17[0xd]);
            auVar44 = vfmadd231ps_avx512vl(auVar42,auVar33,pauVar17[7]);
            auVar42 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
            auVar89 = ZEXT3264(auVar42);
            auVar52 = vfmadd231ps_avx512vl(auVar52,auVar32,pauVar17[2]);
            auVar53 = vfmadd231ps_avx512vl(auVar43,auVar32,pauVar17[3]);
            auVar57 = vfmadd231ps_avx512vl(auVar44,auVar32,pauVar17[4]);
            auVar42 = vsubps_avx(auVar45,auVar52);
            auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                                         CONCAT424(0xfffffff8,
                                                   CONCAT420(0xfffffff8,
                                                             CONCAT416(0xfffffff8,
                                                                       CONCAT412(0xfffffff8,
                                                                                 CONCAT48(0xfffffff8
                                                                                          ,
                                                  0xfffffff8fffffff8)))))));
            auVar45 = vsubps_avx512vl(auVar49,auVar52);
            auVar43 = vsubps_avx(auVar58,auVar53);
            auVar53 = vsubps_avx512vl(auVar50,auVar53);
            auVar44 = vsubps_avx(auVar48,auVar57);
            auVar46 = vsubps_avx512vl(auVar46,auVar57);
            auVar58._4_4_ = auVar60._4_4_ * auVar42._4_4_;
            auVar58._0_4_ = auVar60._0_4_ * auVar42._0_4_;
            auVar58._8_4_ = auVar60._8_4_ * auVar42._8_4_;
            auVar58._12_4_ = auVar60._12_4_ * auVar42._12_4_;
            auVar58._16_4_ = auVar60._16_4_ * auVar42._16_4_;
            auVar58._20_4_ = auVar60._20_4_ * auVar42._20_4_;
            auVar58._24_4_ = auVar60._24_4_ * auVar42._24_4_;
            auVar58._28_4_ = auVar42._28_4_;
            auVar48._4_4_ = auVar60._4_4_ * auVar45._4_4_;
            auVar48._0_4_ = auVar60._0_4_ * auVar45._0_4_;
            auVar48._8_4_ = auVar60._8_4_ * auVar45._8_4_;
            auVar48._12_4_ = auVar60._12_4_ * auVar45._12_4_;
            auVar48._16_4_ = auVar60._16_4_ * auVar45._16_4_;
            auVar48._20_4_ = auVar60._20_4_ * auVar45._20_4_;
            auVar48._24_4_ = auVar60._24_4_ * auVar45._24_4_;
            auVar48._28_4_ = auVar45._28_4_;
            auVar49._4_4_ = auVar59._4_4_ * auVar43._4_4_;
            auVar49._0_4_ = auVar59._0_4_ * auVar43._0_4_;
            auVar49._8_4_ = auVar59._8_4_ * auVar43._8_4_;
            auVar49._12_4_ = auVar59._12_4_ * auVar43._12_4_;
            auVar49._16_4_ = auVar59._16_4_ * auVar43._16_4_;
            auVar49._20_4_ = auVar59._20_4_ * auVar43._20_4_;
            auVar49._24_4_ = auVar59._24_4_ * auVar43._24_4_;
            auVar49._28_4_ = auVar43._28_4_;
            auVar50._4_4_ = auVar51._4_4_ * auVar44._4_4_;
            auVar50._0_4_ = auVar51._0_4_ * auVar44._0_4_;
            auVar50._8_4_ = auVar51._8_4_ * auVar44._8_4_;
            auVar50._12_4_ = auVar51._12_4_ * auVar44._12_4_;
            auVar50._16_4_ = auVar51._16_4_ * auVar44._16_4_;
            auVar50._20_4_ = auVar51._20_4_ * auVar44._20_4_;
            auVar50._24_4_ = auVar51._24_4_ * auVar44._24_4_;
            auVar50._28_4_ = auVar44._28_4_;
            auVar52._4_4_ = auVar59._4_4_ * auVar53._4_4_;
            auVar52._0_4_ = auVar59._0_4_ * auVar53._0_4_;
            auVar52._8_4_ = auVar59._8_4_ * auVar53._8_4_;
            auVar52._12_4_ = auVar59._12_4_ * auVar53._12_4_;
            auVar52._16_4_ = auVar59._16_4_ * auVar53._16_4_;
            auVar52._20_4_ = auVar59._20_4_ * auVar53._20_4_;
            auVar52._24_4_ = auVar59._24_4_ * auVar53._24_4_;
            auVar52._28_4_ = auVar53._28_4_;
            auVar53._4_4_ = auVar51._4_4_ * auVar46._4_4_;
            auVar53._0_4_ = auVar51._0_4_ * auVar46._0_4_;
            auVar53._8_4_ = auVar51._8_4_ * auVar46._8_4_;
            auVar53._12_4_ = auVar51._12_4_ * auVar46._12_4_;
            auVar53._16_4_ = auVar51._16_4_ * auVar46._16_4_;
            auVar53._20_4_ = auVar51._20_4_ * auVar46._20_4_;
            auVar53._24_4_ = auVar51._24_4_ * auVar46._24_4_;
            auVar53._28_4_ = auVar46._28_4_;
            auVar42 = vpminsd_avx2(auVar49,auVar52);
            auVar43 = vpminsd_avx2(auVar50,auVar53);
            auVar42 = vmaxps_avx(auVar42,auVar43);
            auVar46 = vpminsd_avx2(auVar58,auVar48);
            auVar44 = vpmaxsd_avx2(auVar58,auVar48);
            auVar43 = vpmaxsd_avx2(auVar49,auVar52);
            auVar45 = vpmaxsd_avx2(auVar50,auVar53);
            auVar43 = vminps_avx(auVar43,auVar45);
            auVar45 = vmaxps_avx512vl(auVar41,auVar46);
            auVar42 = vmaxps_avx(auVar45,auVar42);
            auVar44 = vminps_avx(auVar69._0_32_,auVar44);
            auVar43 = vminps_avx(auVar44,auVar43);
            auVar44._8_4_ = 0x3f7ffffa;
            auVar44._0_8_ = 0x3f7ffffa3f7ffffa;
            auVar44._12_4_ = 0x3f7ffffa;
            auVar44._16_4_ = 0x3f7ffffa;
            auVar44._20_4_ = 0x3f7ffffa;
            auVar44._24_4_ = 0x3f7ffffa;
            auVar44._28_4_ = 0x3f7ffffa;
            auVar42 = vmulps_avx512vl(auVar42,auVar44);
            auVar45._8_4_ = 0x3f800003;
            auVar45._0_8_ = 0x3f8000033f800003;
            auVar45._12_4_ = 0x3f800003;
            auVar45._16_4_ = 0x3f800003;
            auVar45._20_4_ = 0x3f800003;
            auVar45._24_4_ = 0x3f800003;
            auVar45._28_4_ = 0x3f800003;
            auVar43 = vmulps_avx512vl(auVar43,auVar45);
            uVar23 = vcmpps_avx512vl(auVar42,auVar43,2);
          }
          else {
            auVar71._4_4_ = fVar82;
            auVar71._0_4_ = fVar82;
            auVar71._8_4_ = fVar82;
            auVar71._12_4_ = fVar82;
            auVar71._16_4_ = fVar82;
            auVar71._20_4_ = fVar82;
            auVar71._24_4_ = fVar82;
            auVar71._28_4_ = fVar82;
            auVar27 = vfmadd213ps_fma(pauVar17[uVar22 + 8],auVar71,pauVar17[uVar22 + 2]);
            auVar42 = vsubps_avx512vl(ZEXT1632(auVar27),auVar32);
            auVar43 = vmulps_avx512vl(auVar35,auVar42);
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + uVar20),auVar71,
                                      *(undefined1 (*) [32])(pauVar17[2] + uVar20));
            auVar42 = vsubps_avx512vl(ZEXT1632(auVar27),auVar33);
            auVar42 = vmulps_avx512vl(auVar36,auVar42);
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + uVar21),auVar71,
                                      *(undefined1 (*) [32])(pauVar17[2] + uVar21));
            auVar44 = vsubps_avx512vl(ZEXT1632(auVar27),auVar34);
            auVar44 = vmulps_avx512vl(auVar37,auVar44);
            auVar42 = vmaxps_avx(auVar42,auVar44);
            auVar43 = vmaxps_avx512vl(auVar41,auVar43);
            auVar42 = vmaxps_avx(auVar43,auVar42);
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + uVar18),auVar71,
                                      *(undefined1 (*) [32])(pauVar17[2] + uVar18));
            auVar43 = vsubps_avx512vl(ZEXT1632(auVar27),auVar32);
            auVar44 = vmulps_avx512vl(auVar38,auVar43);
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + (uVar20 ^ 0x20)),auVar71,
                                      *(undefined1 (*) [32])(pauVar17[2] + (uVar20 ^ 0x20)));
            auVar43 = vsubps_avx512vl(ZEXT1632(auVar27),auVar33);
            auVar43 = vmulps_avx512vl(auVar39,auVar43);
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar17[8] + (uVar21 ^ 0x20)),auVar71,
                                      *(undefined1 (*) [32])(pauVar17[2] + (uVar21 ^ 0x20)));
            auVar45 = vsubps_avx512vl(ZEXT1632(auVar27),auVar34);
            auVar45 = vmulps_avx512vl(auVar40,auVar45);
            auVar43 = vminps_avx(auVar43,auVar45);
            auVar44 = vminps_avx(auVar69._0_32_,auVar44);
            auVar43 = vminps_avx(auVar44,auVar43);
            uVar23 = vcmpps_avx512vl(auVar42,auVar43,2);
            if (uVar14 == 6) {
              uVar8 = vcmpps_avx512vl(auVar71,pauVar17[0xe],0xd);
              uVar9 = vcmpps_avx512vl(auVar71,pauVar17[0xf],1);
              uVar23 = uVar23 & uVar8 & uVar9;
            }
          }
          bVar13 = (byte)uVar23;
          if (bVar13 == 0) goto LAB_01f16aee;
          auVar43 = *pauVar17;
          auVar44 = pauVar17[1];
          auVar45 = vpternlogd_avx512vl(auVar89._0_32_,auVar42,auVar90._0_32_,0xf8);
          auVar46 = vpcompressd_avx512vl(auVar45);
          auVar47._0_4_ =
               (uint)(bVar13 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar45._0_4_;
          bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar47._4_4_ = (uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * auVar45._4_4_;
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar47._8_4_ = (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * auVar45._8_4_;
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar47._12_4_ = (uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * auVar45._12_4_;
          bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar47._16_4_ = (uint)bVar5 * auVar46._16_4_ | (uint)!bVar5 * auVar45._16_4_;
          bVar5 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar47._20_4_ = (uint)bVar5 * auVar46._20_4_ | (uint)!bVar5 * auVar45._20_4_;
          bVar5 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar47._24_4_ = (uint)bVar5 * auVar46._24_4_ | (uint)!bVar5 * auVar45._24_4_;
          bVar5 = SUB81(uVar23 >> 7,0);
          auVar47._28_4_ = (uint)bVar5 * auVar46._28_4_ | (uint)!bVar5 * auVar45._28_4_;
          auVar45 = vpermt2q_avx512vl(auVar43,auVar47,auVar44);
          uVar23 = auVar45._0_8_;
          bVar13 = bVar13 - 1 & bVar13;
          if (bVar13 != 0) {
            auVar45 = vpshufd_avx2(auVar47,0x55);
            vpermt2q_avx512vl(auVar43,auVar45,auVar44);
            auVar46 = vpminsd_avx2(auVar47,auVar45);
            auVar45 = vpmaxsd_avx2(auVar47,auVar45);
            bVar13 = bVar13 - 1 & bVar13;
            if (bVar13 == 0) {
              auVar46 = vpermi2q_avx512vl(auVar46,auVar43,auVar44);
              uVar23 = auVar46._0_8_;
              auVar43 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
              *puVar19 = auVar43._0_8_;
              auVar42 = vpermd_avx2(auVar45,auVar42);
              *(int *)(puVar19 + 1) = auVar42._0_4_;
              puVar19 = puVar19 + 2;
            }
            else {
              auVar51 = vpshufd_avx2(auVar47,0xaa);
              vpermt2q_avx512vl(auVar43,auVar51,auVar44);
              auVar60 = vpminsd_avx2(auVar46,auVar51);
              auVar46 = vpmaxsd_avx2(auVar46,auVar51);
              auVar51 = vpminsd_avx2(auVar45,auVar46);
              auVar45 = vpmaxsd_avx2(auVar45,auVar46);
              bVar13 = bVar13 - 1 & bVar13;
              if (bVar13 == 0) {
                auVar46 = vpermi2q_avx512vl(auVar60,auVar43,auVar44);
                uVar23 = auVar46._0_8_;
                auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
                *puVar19 = auVar46._0_8_;
                auVar45 = vpermd_avx2(auVar45,auVar42);
                *(int *)(puVar19 + 1) = auVar45._0_4_;
                auVar43 = vpermt2q_avx512vl(auVar43,auVar51,auVar44);
                puVar19[2] = auVar43._0_8_;
                auVar42 = vpermd_avx2(auVar51,auVar42);
                *(int *)(puVar19 + 3) = auVar42._0_4_;
                puVar19 = puVar19 + 4;
              }
              else {
                auVar46 = vpshufd_avx2(auVar47,0xff);
                vpermt2q_avx512vl(auVar43,auVar46,auVar44);
                auVar59 = vpminsd_avx2(auVar60,auVar46);
                auVar46 = vpmaxsd_avx2(auVar60,auVar46);
                auVar60 = vpminsd_avx2(auVar51,auVar46);
                auVar46 = vpmaxsd_avx2(auVar51,auVar46);
                auVar51 = vpminsd_avx2(auVar45,auVar46);
                auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                bVar13 = bVar13 - 1 & bVar13;
                if (bVar13 == 0) {
                  auVar46 = vpermi2q_avx512vl(auVar59,auVar43,auVar44);
                  uVar23 = auVar46._0_8_;
                  auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
                  *puVar19 = auVar46._0_8_;
                  auVar45 = vpermd_avx2(auVar45,auVar42);
                  *(int *)(puVar19 + 1) = auVar45._0_4_;
                  auVar45 = vpermt2q_avx512vl(auVar43,auVar51,auVar44);
                  puVar19[2] = auVar45._0_8_;
                  auVar45 = vpermd_avx2(auVar51,auVar42);
                  *(int *)(puVar19 + 3) = auVar45._0_4_;
                  auVar43 = vpermt2q_avx512vl(auVar43,auVar60,auVar44);
                  puVar19[4] = auVar43._0_8_;
                  auVar42 = vpermd_avx2(auVar60,auVar42);
                  *(int *)(puVar19 + 5) = auVar42._0_4_;
                  puVar19 = puVar19 + 6;
                }
                else {
                  auVar58 = valignd_avx512vl(auVar47,auVar47,3);
                  auVar46 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar59 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar46,auVar59);
                  auVar46 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar60 = vpermt2d_avx512vl(auVar59,auVar46,auVar60);
                  auVar60 = vpermt2d_avx512vl(auVar60,auVar46,auVar51);
                  auVar46 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar45 = vpermt2d_avx512vl(auVar60,auVar46,auVar45);
                  auVar89 = ZEXT3264(auVar45);
                  bVar16 = bVar13;
                  do {
                    auVar46 = auVar89._0_32_;
                    auVar77._8_4_ = 1;
                    auVar77._0_8_ = 0x100000001;
                    auVar77._12_4_ = 1;
                    auVar77._16_4_ = 1;
                    auVar77._20_4_ = 1;
                    auVar77._24_4_ = 1;
                    auVar77._28_4_ = 1;
                    auVar45 = vpermd_avx2(auVar77,auVar58);
                    auVar58 = valignd_avx512vl(auVar58,auVar58,1);
                    vpermt2q_avx512vl(auVar43,auVar58,auVar44);
                    bVar16 = bVar16 - 1 & bVar16;
                    uVar7 = vpcmpd_avx512vl(auVar45,auVar46,5);
                    auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                    bVar10 = (byte)uVar7 << 1;
                    auVar46 = valignd_avx512vl(auVar46,auVar46,7);
                    bVar5 = (bool)((byte)uVar7 & 1);
                    auVar61._4_4_ = (uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * auVar45._4_4_;
                    auVar61._0_4_ = auVar45._0_4_;
                    bVar5 = (bool)(bVar10 >> 2 & 1);
                    auVar61._8_4_ = (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * auVar45._8_4_;
                    bVar5 = (bool)(bVar10 >> 3 & 1);
                    auVar61._12_4_ = (uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * auVar45._12_4_;
                    bVar5 = (bool)(bVar10 >> 4 & 1);
                    auVar61._16_4_ = (uint)bVar5 * auVar46._16_4_ | (uint)!bVar5 * auVar45._16_4_;
                    bVar5 = (bool)(bVar10 >> 5 & 1);
                    auVar61._20_4_ = (uint)bVar5 * auVar46._20_4_ | (uint)!bVar5 * auVar45._20_4_;
                    bVar5 = (bool)(bVar10 >> 6 & 1);
                    auVar61._24_4_ = (uint)bVar5 * auVar46._24_4_ | (uint)!bVar5 * auVar45._24_4_;
                    auVar61._28_4_ =
                         (uint)(bVar10 >> 7) * auVar46._28_4_ |
                         (uint)!(bool)(bVar10 >> 7) * auVar45._28_4_;
                    auVar89 = ZEXT3264(auVar61);
                  } while (bVar16 != 0);
                  lVar15 = (ulong)(uint)POPCOUNT((uint)bVar13) + 3;
                  do {
                    auVar45 = vpermi2q_avx512vl(auVar61,auVar43,auVar44);
                    *puVar19 = auVar45._0_8_;
                    auVar46 = auVar89._0_32_;
                    auVar45 = vpermd_avx2(auVar46,auVar42);
                    *(int *)(puVar19 + 1) = auVar45._0_4_;
                    auVar61 = valignd_avx512vl(auVar46,auVar46,1);
                    puVar19 = puVar19 + 2;
                    auVar89 = ZEXT3264(auVar61);
                    lVar15 = lVar15 + -1;
                  } while (lVar15 != 0);
                  auVar42 = vpermt2q_avx512vl(auVar43,auVar61,auVar44);
                  uVar23 = auVar42._0_8_;
                }
                auVar42 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                auVar89 = ZEXT3264(auVar42);
                auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                                             CONCAT424(0xfffffff8,
                                                       CONCAT420(0xfffffff8,
                                                                 CONCAT416(0xfffffff8,
                                                                           CONCAT412(0xfffffff8,
                                                                                     CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
              }
            }
          }
        }
        in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(uVar23 & 0xfffffffffffffff0) * 0x40))(local_23b8,ray,context);
        auVar90 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        auVar42 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar89 = ZEXT3264(auVar42);
        fVar82 = (ray->super_RayK<1>).tfar;
        auVar69 = ZEXT3264(CONCAT428(fVar82,CONCAT424(fVar82,CONCAT420(fVar82,CONCAT416(fVar82,
                                                  CONCAT412(fVar82,CONCAT48(fVar82,CONCAT44(fVar82,
                                                  fVar82))))))));
      }
LAB_01f16aee:
    } while (puVar19 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }